

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void clearAllObjects(void)

{
  bool bVar1;
  shared_ptr<MasterObjectHolder> holder;
  MasterObjectHolder *in_stack_000001e0;
  __shared_ptr local_10 [16];
  
  getMasterHolder();
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_10);
  if (bVar1) {
    std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a2348);
    MasterObjectHolder::deleteAll(in_stack_000001e0);
  }
  std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1a2378);
  return;
}

Assistant:

void clearAllObjects()
{
    auto holder = getMasterHolder();
    if (holder) {
        holder->deleteAll();
    }
}